

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

int wally_scriptsig_multisig_from_bytes
              (uchar *script,size_t script_len,uchar *bytes,size_t bytes_len,uint32_t *sighash,
              size_t sighash_len,uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  size_t *written_00;
  uchar *puVar5;
  uchar *bytes_out_00;
  long lVar6;
  long lVar7;
  size_t sVar8;
  size_t der_len [15];
  uchar der_buff [1095];
  ulong local_4f8 [16];
  uchar local_478 [1096];
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((bytes_len == 0 || bytes == (uchar *)0x0) || (script_len == 0 || script == (uchar *)0x0)) {
    return -2;
  }
  if (sighash == (uint32_t *)0x0) {
    return -2;
  }
  if (bytes_len < 0x40) {
    return -2;
  }
  if ((bytes_len & 0xfffffffffffffc3f) != 0) {
    return -2;
  }
  uVar3 = bytes_len >> 6;
  if ((bytes_out == (uchar *)0x0 || written == (size_t *)0x0) ||
      (flags != 0 || uVar3 != sighash_len)) {
    return -2;
  }
  puVar5 = local_478;
  lVar6 = 0;
  lVar7 = 0;
  do {
    if (0xff < *sighash) {
      iVar1 = -2;
      goto LAB_001052c2;
    }
    written_00 = (size_t *)((long)local_4f8 + lVar6);
    iVar1 = wally_ec_sig_to_der(bytes,0x40,puVar5,0x49,written_00);
    if (iVar1 != 0) goto LAB_001052c2;
    sVar8 = *written_00;
    puVar5[sVar8] = (uchar)*sighash;
    uVar2 = sVar8 + 1;
    *written_00 = uVar2;
    lVar4 = 1;
    if ((0x4b < uVar2) && (lVar4 = 2, 0xff < uVar2)) {
      lVar4 = (ulong)(0xffff < uVar2) * 2 + 3;
    }
    lVar7 = lVar7 + uVar2 + lVar4;
    lVar6 = lVar6 + 8;
    puVar5 = puVar5 + 0x49;
    sighash = sighash + 1;
    bytes = bytes + 0x40;
  } while (uVar3 * 8 != lVar6);
  lVar6 = 1;
  if ((0x4b < script_len) && (lVar6 = 2, 0xff < script_len)) {
    lVar6 = (ulong)(0xffff < script_len) * 2 + 3;
  }
  uVar2 = lVar6 + lVar7 + script_len + 1;
  if (uVar2 <= len) {
    *bytes_out = '\0';
    sVar8 = len - 1;
    bytes_out_00 = bytes_out + 1;
    puVar5 = local_478;
    lVar6 = 0;
    do {
      iVar1 = wally_script_push_from_bytes
                        (puVar5,*(size_t *)((long)local_4f8 + lVar6),0,bytes_out_00,sVar8,
                         (size_t *)((long)local_4f8 + lVar6));
      if (iVar1 != 0) goto LAB_001052c2;
      bytes_out_00 = bytes_out_00 + *(long *)((long)local_4f8 + lVar6);
      sVar8 = sVar8 - *(long *)((long)local_4f8 + lVar6);
      lVar6 = lVar6 + 8;
      puVar5 = puVar5 + 0x49;
    } while ((uVar3 + (uVar3 == 0)) * 8 != lVar6);
    iVar1 = wally_script_push_from_bytes(script,script_len,0,bytes_out_00,sVar8,local_4f8);
    if (iVar1 != 0) goto LAB_001052c2;
    if (sVar8 < local_4f8[0]) {
      return -1;
    }
  }
  *written = uVar2;
  iVar1 = 0;
LAB_001052c2:
  wally_clear(local_478,0x447);
  return iVar1;
}

Assistant:

int wally_scriptsig_multisig_from_bytes(
    const unsigned char *script, size_t script_len,
    const unsigned char *bytes, size_t bytes_len,
    const uint32_t *sighash, size_t sighash_len, uint32_t flags,
    unsigned char *bytes_out, size_t len, size_t *written)
{
#define MAX_DER (EC_SIGNATURE_DER_MAX_LEN + 1)
    unsigned char der_buff[15 * MAX_DER], *p = bytes_out;
    size_t der_len[15];
    size_t i, required = 0, n_sigs = bytes_len / EC_SIGNATURE_LEN;
    int ret = WALLY_OK;

    if (written)
        *written = 0;

    if (!script || !script_len || !bytes || !bytes_len || bytes_len % EC_SIGNATURE_LEN ||
        n_sigs < 1 || n_sigs > 15 || !sighash || sighash_len != n_sigs ||
        flags || !bytes_out || !written)
        return WALLY_EINVAL;

    /* Create and store the DER encoded signatures with lengths */
    for (i = 0; i < n_sigs; ++i) {
        if (sighash[i] & ~0xff) {
            ret = WALLY_EINVAL;
            goto cleanup;
        }
        ret = wally_ec_sig_to_der(bytes + i * EC_SIGNATURE_LEN, EC_SIGNATURE_LEN,
                                  &der_buff[i * MAX_DER], MAX_DER, &der_len[i]);
        if (ret != WALLY_OK)
            goto cleanup;
        der_buff[i * MAX_DER + der_len[i]] = sighash[i] & 0xff;
        ++der_len[i];
        required += script_get_push_size(der_len[i]);
    }

    /* Account for the initial OP_0 and final script push */
    required += 1 + script_get_push_size(script_len);

    if (len < required) {
        *written = required;
        goto cleanup;
    }

    *p++ = OP_0;
    len--;
    for (i = 0; i < n_sigs; ++i) {
        ret = wally_script_push_from_bytes(&der_buff[i * MAX_DER], der_len[i],
                                           0, p, len, &der_len[i]);
        if (ret != WALLY_OK)
            goto cleanup;
        p += der_len[i];
        len -= der_len[i];
    }
    ret = wally_script_push_from_bytes(script, script_len,
                                       0, p, len, &der_len[0]);
    if (ret != WALLY_OK)
        goto cleanup;
    if (len < der_len[0])
        return WALLY_ERROR; /* Required length mismatch, should not happen! */
    *written = required;

cleanup:
    wally_clear(der_buff, sizeof(der_buff));
    return ret;
}